

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

iterator __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getItFor
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *bucket)

{
  bool bVar1;
  iterator this_00;
  type lt;
  Bucket *in_RSI;
  set<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>,_std::less<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>,_std::allocator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>_>
  *in_RDI;
  iterator it;
  _Self local_8;
  
  local_8._M_node =
       (_Base_ptr)
       std::
       set<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>,_std::less<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>,_std::allocator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>_>
       ::begin(in_RDI);
  while( true ) {
    this_00 = std::
              set<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>,_std::less<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>,_std::allocator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>_>
              ::end(in_RDI);
    bVar1 = std::operator!=(&local_8,(_Self *)&stack0xffffffffffffffe0);
    if (!bVar1) {
      abort();
    }
    std::
    _Rb_tree_const_iterator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>
    ::operator*((_Rb_tree_const_iterator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>
                 *)0x1e08d6);
    lt = std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>::operator*
                   ((unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_> *)
                    this_00._M_node);
    bVar1 = vr::operator==(lt,in_RSI);
    if (bVar1) break;
    std::
    _Rb_tree_const_iterator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>
    ::operator++((_Rb_tree_const_iterator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>
                  *)this_00._M_node);
  }
  return (iterator)local_8._M_node;
}

Assistant:

UniqueBucketSet::iterator getItFor(const Bucket &bucket) const {
        for (auto it = buckets.begin(); it != buckets.end(); ++it) {
            if (**it == bucket)
                return it;
        }
        assert(0 && "unreachable");
        abort();
    }